

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acutest.h
# Opt level: O0

void acutest_line_indent_(int level)

{
  int in_EDI;
  int n;
  uint local_8;
  
  local_8 = in_EDI * 2;
  if ((acutest_tap_ != 0) && (0 < (int)local_8)) {
    local_8 = local_8 - 1;
    printf("#");
  }
  for (; 0x10 < (int)local_8; local_8 = local_8 - 0x10) {
    printf("%s","                ");
  }
  printf("%.*s",(ulong)local_8,"                ");
  return;
}

Assistant:

static void
acutest_line_indent_(int level)
{
    static const char spaces[] = "                ";
    int n = level * 2;

    if(acutest_tap_  &&  n > 0) {
        n--;
        printf("#");
    }

    while(n > 16) {
        printf("%s", spaces);
        n -= 16;
    }
    printf("%.*s", n, spaces);
}